

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *param_1)

{
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>_>::optional
            (&this->_attrib,&param_1->_attrib);
  this->_empty = param_1->_empty;
  Animatable<tinyusdz::value::color3f>::Animatable(&this->_fallback,&param_1->_fallback);
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }